

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::VECTOR_FLATTEN_DIM_3_Test::~VECTOR_FLATTEN_DIM_3_Test
          (VECTOR_FLATTEN_DIM_3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(VECTOR_FLATTEN, DIM_3) {
        vector_dim<int, 3>::type v = {
                {
                        {1,2,3},
                        {4,5}
                },
                {
                        {6,7,8},
                        {9}
                }
        };
        vector<int> res = vec_flater<int, 3>::flatten(v);
        EXPECT_EQ(res.size(), 9);
        EXPECT_EQ(res, vector<int>({1,2,3,4,5,6,7,8,9}));
    }